

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O2

t_value<xemmai::t_pointer> __thiscall
xemmai::t_value<xemmai::t_pointer>::f_invoke<xemmai::t_value<xemmai::t_pointer>,long,long>
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index,
          t_value<xemmai::t_pointer> *a_arguments,long *a_arguments_1,long *a_arguments_2)

{
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  long in_FS_OFFSET;
  t_value<xemmai::t_pointer> tVar2;
  long *in_stack_00000008;
  t_scoped_stack stack;
  
  t_scoped_stack::t_scoped_stack<xemmai::t_value<xemmai::t_pointer>,long,long>
            (&stack,5,(t_value<xemmai::t_pointer> *)a_arguments_1,a_arguments_2,in_stack_00000008);
  stack.v_p[1].super_t_pointer.v_p = (t_object *)0x0;
  f_call((t_value<xemmai::t_pointer> *)a_key,(t_object *)a_index,(size_t *)a_arguments,stack.v_p,3);
  aVar1 = (stack.v_p)->field_0;
  (this->super_t_pointer).v_p = ((stack.v_p)->super_t_pointer).v_p;
  this->field_0 = aVar1;
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = stack.v_p;
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

inline t_pvalue t_value<T_tag>::f_invoke(t_object* a_key, size_t& a_index, auto&&... a_arguments) const
{
	t_scoped_stack stack(sizeof...(a_arguments) + 2, std::forward<decltype(a_arguments)>(a_arguments)...);
	stack[1] = nullptr;
	f_call(a_key, a_index, stack, sizeof...(a_arguments));
	return stack[0];
}